

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmutil.c
# Opt level: O2

PmQueue * Pm_QueueCreate(long num_msgs,int32_t bytes_per_msg)

{
  int iVar1;
  undefined8 *ptr;
  void *pvVar2;
  int iVar3;
  long lVar4;
  
  ptr = (undefined8 *)pm_alloc(0x40);
  if (ptr != (undefined8 *)0x0) {
    iVar1 = (int)((long)bytes_per_msg + 3U >> 2);
    iVar3 = iVar1 + 1;
    lVar4 = iVar3 * num_msgs;
    ptr[2] = lVar4;
    pvVar2 = pm_alloc(lVar4 * 4);
    ptr[5] = pvVar2;
    memset(pvVar2,0,ptr[2] << 2);
    if (ptr[5] != 0) {
      pvVar2 = pm_alloc((long)iVar1 << 2);
      ptr[6] = pvVar2;
      if (pvVar2 != (void *)0x0) {
        memset((void *)ptr[5],0,ptr[2] << 2);
        *ptr = 0;
        ptr[1] = 0;
        *(int *)(ptr + 4) = iVar3;
        ptr[3] = 0;
        *(undefined4 *)((long)ptr + 0x24) = 0;
        *(undefined4 *)(ptr + 7) = 0;
        return ptr;
      }
      pm_free((void *)ptr[5]);
    }
    pm_free(ptr);
  }
  return (PmQueue *)0x0;
}

Assistant:

PMEXPORT PmQueue *Pm_QueueCreate(long num_msgs, int32_t bytes_per_msg)
{
    int32_t int32s_per_msg = 
            (int32_t) (((bytes_per_msg + sizeof(int32_t) - 1) &
                       ~(sizeof(int32_t) - 1)) / sizeof(int32_t));
    PmQueueRep *queue = (PmQueueRep *) pm_alloc(sizeof(PmQueueRep));
    if (!queue) /* memory allocation failed */
        return NULL;

    /* need extra word per message for non-zero encoding */
    queue->len = num_msgs * (int32s_per_msg + 1);
    queue->buffer = (int32_t *) pm_alloc(queue->len * sizeof(int32_t));
    bzero(queue->buffer, queue->len * sizeof(int32_t));
    if (!queue->buffer) {
        pm_free(queue);
        return NULL;
    } else { /* allocate the "peek" buffer */
        queue->peek = (int32_t *) pm_alloc(int32s_per_msg * sizeof(int32_t));
        if (!queue->peek) {
            /* free everything allocated so far and return */
            pm_free(queue->buffer);
            pm_free(queue);
            return NULL;
        }
    }
    bzero(queue->buffer, queue->len * sizeof(int32_t));
    queue->head = 0;
    queue->tail = 0;
    /* msg_size is in words */
    queue->msg_size = int32s_per_msg + 1; /* note extra word is counted */
    queue->overflow = FALSE;
    queue->peek_overflow = FALSE;
    queue->peek_flag = FALSE;
    return queue;
}